

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Var __thiscall GlobOpt::GetConstantVar(GlobOpt *this,Opnd *opnd,Value *val)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  int iVar4;
  ValueInfo *this_00;
  VarConstantValueInfo *this_01;
  IntConstOpnd *pIVar5;
  RegOpnd *pRVar6;
  AddrOpnd *pAVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  ScriptContextInfo *pSVar9;
  undefined4 extraout_var_00;
  Instr *pIVar10;
  Opnd *pOVar11;
  FloatConstOpnd *pFVar12;
  Var pvVar13;
  Instr *defInstr_1;
  Instr *defInstr;
  AddrOpnd *addrOpnd;
  ValueInfo *valueInfo;
  Value *val_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  
  this_00 = ::Value::GetValueInfo(val);
  bVar2 = ValueInfo::IsVarConstant(this_00);
  if ((bVar2) && (bVar2 = ValueType::IsPrimitive(&this_00->super_ValueType), bVar2)) {
    this_01 = ValueInfo::AsVarConstant(this_00);
    pvVar13 = VarConstantValueInfo::VarValue(this_01,false);
    return pvVar13;
  }
  bVar2 = IR::Opnd::IsAddrOpnd(opnd);
  if (bVar2) {
    pAVar7 = IR::Opnd::AsAddrOpnd(opnd);
    bVar2 = IR::AddrOpnd::IsVar(pAVar7);
    if (bVar2) {
      return pAVar7->m_address;
    }
  }
  else {
    bVar2 = IR::Opnd::IsIntConstOpnd(opnd);
    if (bVar2) {
      pIVar5 = IR::Opnd::AsIntConstOpnd(opnd);
      iVar3 = IR::IntConstOpnd::AsInt32(pIVar5);
      bVar2 = Js::TaggedInt::IsOverflow(iVar3);
      if (!bVar2) {
        pIVar5 = IR::Opnd::AsIntConstOpnd(opnd);
        iVar3 = IR::IntConstOpnd::AsInt32(pIVar5);
        pvVar13 = Js::TaggedInt::ToVarUnchecked(iVar3);
        return pvVar13;
      }
    }
    else {
      bVar2 = IR::Opnd::IsFloatConstOpnd(opnd);
      if (bVar2) {
        pFVar12 = IR::Opnd::AsFloatConstOpnd(opnd);
        pvVar13 = Js::JavascriptNumber::ToVar(pFVar12->m_value);
        return pvVar13;
      }
      bVar2 = IR::Opnd::IsRegOpnd(opnd);
      if (bVar2) {
        pRVar6 = IR::Opnd::AsRegOpnd(opnd);
        bVar2 = StackSym::IsSingleDef(pRVar6->m_sym);
        if (bVar2) {
          bVar2 = ValueType::IsBoolean(&this_00->super_ValueType);
          if (bVar2) {
            pRVar6 = IR::Opnd::AsRegOpnd(opnd);
            pIVar10 = StackSym::GetInstrDef(pRVar6->m_sym);
            if (pIVar10->m_opcode == Ld_A) {
              pOVar11 = IR::Instr::GetSrc1(pIVar10);
              bVar2 = IR::Opnd::IsAddrOpnd(pOVar11);
              if (bVar2) {
                pOVar11 = IR::Instr::GetSrc1(pIVar10);
                pAVar7 = IR::Opnd::AsAddrOpnd(pOVar11);
                bVar2 = IR::AddrOpnd::IsVar(pAVar7);
                if (!bVar2) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar8 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x1a14,"(defInstr->GetSrc1()->AsAddrOpnd()->IsVar())",
                                     "defInstr->GetSrc1()->AsAddrOpnd()->IsVar()");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar8 = 0;
                }
                pOVar11 = IR::Instr::GetSrc1(pIVar10);
                pAVar7 = IR::Opnd::AsAddrOpnd(pOVar11);
                return pAVar7->m_address;
              }
            }
            return (Var)0x0;
          }
          bVar2 = ValueType::IsUndefined(&this_00->super_ValueType);
          if (bVar2) {
            pSVar9 = Func::GetScriptContextInfo(this->func);
            iVar4 = (*pSVar9->_vptr_ScriptContextInfo[1])();
            return (Var)CONCAT44(extraout_var,iVar4);
          }
          bVar2 = ValueType::IsNull(&this_00->super_ValueType);
          if (bVar2) {
            pSVar9 = Func::GetScriptContextInfo(this->func);
            iVar4 = (**pSVar9->_vptr_ScriptContextInfo)();
            return (Var)CONCAT44(extraout_var_00,iVar4);
          }
          bVar2 = ValueType::IsFloat(&this_00->super_ValueType);
          if (bVar2) {
            pRVar6 = IR::Opnd::AsRegOpnd(opnd);
            pIVar10 = StackSym::GetInstrDef(pRVar6->m_sym);
            if ((pIVar10->m_opcode == LdC_F8_R8) || (pIVar10->m_opcode == LdC_A_R8)) {
              pOVar11 = IR::Instr::GetSrc1(pIVar10);
              bVar2 = IR::Opnd::IsFloatConstOpnd(pOVar11);
              if (bVar2) {
                pOVar11 = IR::Instr::GetSrc1(pIVar10);
                pFVar12 = IR::Opnd::AsFloatConstOpnd(pOVar11);
                pvVar13 = Js::JavascriptNumber::ToVar(pFVar12->m_value);
                return pvVar13;
              }
            }
          }
        }
      }
    }
  }
  return (Var)0x0;
}

Assistant:

Js::Var // TODO: michhol OOP JIT, shouldn't play with Vars
GlobOpt::GetConstantVar(IR::Opnd *opnd, Value *val)
{
    ValueInfo *valueInfo = val->GetValueInfo();

    if (valueInfo->IsVarConstant() && valueInfo->IsPrimitive())
    {
        return valueInfo->AsVarConstant()->VarValue();
    }
    if (opnd->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        if (addrOpnd->IsVar())
        {
            return addrOpnd->m_address;
        }
    }
    else if (opnd->IsIntConstOpnd())
    {
        if (!Js::TaggedInt::IsOverflow(opnd->AsIntConstOpnd()->AsInt32()))
        {
            return Js::TaggedInt::ToVarUnchecked(opnd->AsIntConstOpnd()->AsInt32());
        }
    }
#if FLOATVAR
    else if (opnd->IsFloatConstOpnd())
    {
        return Js::JavascriptNumber::ToVar(opnd->AsFloatConstOpnd()->m_value);
    }
#endif
    else if (opnd->IsRegOpnd() && opnd->AsRegOpnd()->m_sym->IsSingleDef())
    {
        if (valueInfo->IsBoolean())
        {
            IR::Instr * defInstr = opnd->AsRegOpnd()->m_sym->GetInstrDef();

            if (defInstr->m_opcode != Js::OpCode::Ld_A || !defInstr->GetSrc1()->IsAddrOpnd())
            {
                return nullptr;
            }
            Assert(defInstr->GetSrc1()->AsAddrOpnd()->IsVar());
            return defInstr->GetSrc1()->AsAddrOpnd()->m_address;
        }
        else if (valueInfo->IsUndefined())
        {
            return (Js::Var)this->func->GetScriptContextInfo()->GetUndefinedAddr();
        }
        else if (valueInfo->IsNull())
        {
            return (Js::Var)this->func->GetScriptContextInfo()->GetNullAddr();
        }
#if FLOATVAR
        else if (valueInfo->IsFloat())
        {
            IR::Instr * defInstr = opnd->AsRegOpnd()->m_sym->GetInstrDef();
            if ((defInstr->m_opcode == Js::OpCode::LdC_F8_R8 || defInstr->m_opcode == Js::OpCode::LdC_A_R8) && defInstr->GetSrc1()->IsFloatConstOpnd())
            {
                return Js::JavascriptNumber::ToVar(defInstr->GetSrc1()->AsFloatConstOpnd()->m_value);
            }
        }
#endif
    }

    return nullptr;
}